

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O1

bool __thiscall SayIntentionsConnection::ProcessFetchedData(SayIntentionsConnection *this)

{
  double dVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  JSON_Array *pJVar7;
  size_t sVar8;
  JSON_Object *object;
  unsigned_long _num;
  long lVar9;
  long lVar10;
  mapped_type *this_00;
  char *pcVar11;
  SayIntentionsConnection *this_01;
  char *__s;
  ulong index;
  bool bVar12;
  unique_lock<std::mutex> mapFdLock;
  FDKeyTy fdKey;
  string acFilter;
  FDDynamicData dyn;
  FDStaticData stat;
  positionTy viewPos;
  allocator<char> local_39a;
  allocator<char> local_399;
  JSON_Value *local_398;
  pthread_mutex_t *local_390;
  double local_388;
  string local_380;
  unique_lock<std::mutex> local_360;
  SayIntentionsConnection *local_350;
  JSON_Array *local_348;
  FDKeyTy local_340;
  double local_310;
  string *local_308;
  positionTy local_300;
  long *local_2b8;
  size_t local_2b0;
  long local_2a8 [2];
  string local_298;
  string local_278;
  FDDynamicData local_258;
  undefined1 local_210 [216];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  _Alloc_hider local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined2 local_80;
  positionTy local_78;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    return true;
  }
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse != 200) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  local_398 = json_parse_string((char *)0x19d577);
  if (local_398 == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
             ,0x70,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  else {
    pJVar7 = json_array(local_398);
    if (pJVar7 != (JSON_Array *)0x0) {
      DataRefs::GetViewPos();
      local_350 = this;
      local_348 = pJVar7;
      DataRefs::GetDebugAcFilter_abi_cxx11_(&local_278,&dataRefs);
      local_308 = &dataRefs.sSIDisplayName;
      for (index = 0; sVar8 = json_array_get_count(local_348), index < sVar8; index = index + 1) {
        object = json_array_get_object(local_348,index);
        if (object != (JSON_Object *)0x0) {
          jog_s(object,"displayname");
          iVar5 = std::__cxx11::string::compare((char *)local_308);
          if (iVar5 != 0) {
            dVar1 = json_object_dotget_number(object,"flight_id");
            _num = lround(dVar1);
            LTFlightData::FDKeyTy::FDKeyTy(&local_340,KEY_SAYINTENTIONS,_num);
            sVar3 = local_278._M_string_length;
            if (local_278._M_string_length == 0) {
LAB_0019d6ce:
              bVar12 = false;
            }
            else {
              local_2b8 = local_2a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b8,local_278._M_dataplus._M_p,
                         local_278._M_dataplus._M_p + local_278._M_string_length);
              bVar12 = true;
              if (local_340.key._M_string_length == local_2b0) {
                if (local_340.key._M_string_length == 0) goto LAB_0019d6ce;
                iVar5 = bcmp(local_340.key._M_dataplus._M_p,local_2b8,local_340.key._M_string_length
                            );
                bVar12 = iVar5 != 0;
              }
            }
            if ((sVar3 != 0) && (local_2b8 != local_2a8)) {
              operator_delete(local_2b8,local_2a8[0] + 1);
            }
            if (!bVar12) {
              local_388 = jog_n_nan(object,"lat");
              local_390 = (pthread_mutex_t *)jog_n_nan(object,"lon");
              dVar1 = json_object_dotget_number(object,"altitude");
              lVar9 = lround(dVar1);
              local_310 = local_350->tsRequest;
              dVar1 = json_object_dotget_number(object,"heading");
              lVar10 = lround(dVar1);
              local_300._head = (double)lVar10;
              local_300._alt = (double)lVar9 * 0.3048;
              local_300._lat = local_388;
              local_300._lon = (double)local_390;
              local_300._ts = local_310;
              local_300._pitch = NAN;
              local_300._roll = NAN;
              local_300.mergeCount = 1;
              local_300._60_4_ = local_300._60_4_ & 0xffff8000;
              local_300.edgeIdx = 0xffffffffffffffff;
              local_388 = CoordDistance(&local_300,&local_78);
              if (local_388 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
                dVar1 = json_object_dotget_number(object,"altitude_agl");
                lVar9 = lround(dVar1);
                if (lVar9 < 1) {
                  local_300._60_4_ = local_300._60_4_ & 0xfffffcff | 0x200;
                }
                local_360._M_device = &mapFdMutex;
                local_360._M_owns = false;
                std::unique_lock<std::mutex>::lock(&local_360);
                local_360._M_owns = true;
                this_00 = std::
                          map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                          ::operator[](&mapFd,&local_340);
                local_390 = (pthread_mutex_t *)&this_00->dataAccessMutex;
                iVar5 = pthread_mutex_lock(local_390);
                if (iVar5 != 0) {
                  std::__throw_system_error(iVar5);
                }
                std::unique_lock<std::mutex>::unlock(&local_360);
                if ((this_00->acKey).key._M_string_length == 0) {
                  LTFlightData::SetKey(this_00,&local_340);
                }
                local_210._0_8_ = local_210 + 0x10;
                local_210._8_8_ = (char *)0x0;
                local_210[0x10] = '\0';
                local_210._32_8_ = local_210 + 0x30;
                local_210._40_8_ = 0;
                local_210[0x30] = '\0';
                local_210._64_8_ = local_210 + 0x50;
                local_210._72_8_ = (char *)0x0;
                local_210[0x50] = '\0';
                local_210._96_8_ = local_210 + 0x70;
                local_210._104_8_ = 0;
                local_210[0x70] = '\0';
                local_210._128_8_ = local_210 + 0x90;
                local_210._136_8_ = 0;
                local_210[0x90] = '\0';
                local_210._160_8_ = local_210 + 0xb0;
                local_210._168_8_ = 0;
                local_210[0xb0] = '\0';
                local_210._192_4_ = -1;
                local_210._196_4_ = -1;
                local_210._200_4_ = 0;
                local_210[0xcc] = false;
                local_210._208_8_ = (Doc8643 *)0x0;
                local_138._M_p = (pointer)&local_128;
                local_130 = 0;
                local_128._M_local_buf[0] = '\0';
                local_108 = (pointer)0x0;
                local_118 = (pointer)0x0;
                pbStack_110 = (pointer)0x0;
                local_100._M_p = (pointer)&local_f0;
                local_f8 = (char *)0x0;
                local_f0._M_local_buf[0] = '\0';
                local_e0._M_p = (pointer)&local_d0;
                local_d8 = 0;
                local_d0._M_local_buf[0] = '\0';
                local_c0._M_p = (pointer)&local_b0;
                local_b8 = 0;
                local_b0._M_local_buf[0] = '\0';
                local_a0._M_p = (pointer)&local_90;
                local_98 = 0;
                local_90._M_local_buf[0] = '\0';
                local_80._0_1_ = false;
                local_80._1_1_ = false;
                pcVar11 = jog_s(object,"tail_number");
                uVar4 = local_210._8_8_;
                strlen(pcVar11);
                std::__cxx11::string::_M_replace((ulong)local_210,0,(char *)uVar4,(ulong)pcVar11);
                pcVar11 = jog_s(object,"aircraft_icao");
                uVar4 = local_210._72_8_;
                strlen(pcVar11);
                std::__cxx11::string::_M_replace
                          ((ulong)(local_210 + 0x40),0,(char *)uVar4,(ulong)pcVar11);
                this_01 = (SayIntentionsConnection *)jog_s(object,"callsign");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_298,(char *)this_01,(allocator<char> *)&local_380);
                UnprocessCallSign((string *)&local_258,this_01,&local_298);
                std::__cxx11::string::operator=((string *)&local_138,(string *)&local_258);
                if ((XPMPTransponderMode *)local_258.radar.size != &local_258.radar.mode) {
                  operator_delete((void *)local_258.radar.size,local_258.radar._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
                pcVar11 = jog_s(object,"origin");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar11,&local_399);
                pcVar11 = jog_s(object,"final_destination");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_380,pcVar11,&local_39a);
                LTFlightData::FDStaticData::setOrigDest
                          ((FDStaticData *)local_210,(string *)&local_258,&local_380);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p,
                                  local_380.field_2._M_allocated_capacity + 1);
                }
                if ((XPMPTransponderMode *)local_258.radar.size != &local_258.radar.mode) {
                  operator_delete((void *)local_258.radar.size,local_258.radar._16_8_ + 1);
                }
                __s = jog_s(object,"displayname");
                pcVar11 = local_f8;
                strlen(__s);
                std::__cxx11::string::_M_replace((ulong)&local_100,0,pcVar11,(ulong)__s);
                LTFlightData::FDDynamicData::FDDynamicData(&local_258);
                local_258.gnd = (local_300._60_4_ & 0x300) == 0x200;
                local_258.heading = local_300._head;
                local_258.spd = jog_n_nan(object,"airspeed");
                local_258.ts = local_300._ts;
                local_258.pChannel = (LTChannel *)local_350;
                LTFlightData::UpdateData(this_00,(FDStaticData *)local_210,local_388,DATREQU_NONE);
                bVar12 = positionTy::isNormal(&local_300,true);
                _Var2._M_p = local_340.key._M_dataplus._M_p;
                if (bVar12) {
                  LTFlightData::AddDynData(this_00,&local_258,0,0,&local_300);
                }
                else if ((int)dataRefs.iLogLevel < 1) {
                  positionTy::dbgTxt_abi_cxx11_(&local_380,&local_300);
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                         ,0xcc,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                         _Var2._M_p,local_380._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_380._M_dataplus._M_p != &local_380.field_2) {
                    operator_delete(local_380._M_dataplus._M_p,
                                    local_380.field_2._M_allocated_capacity + 1);
                  }
                }
                LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_210);
                pthread_mutex_unlock(local_390);
                std::unique_lock<std::mutex>::~unique_lock(&local_360);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340.key._M_dataplus._M_p != &local_340.key.field_2) {
              operator_delete(local_340.key._M_dataplus._M_p,
                              local_340.key.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      bVar12 = true;
      goto LAB_0019de8d;
    }
    if ((int)dataRefs.iLogLevel < 4) {
      uVar6 = json_type(local_398);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
             ,0x76,"ProcessFetchedData",logERR,"Expected a JSON Array, but got type %d",(ulong)uVar6
            );
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  bVar12 = false;
LAB_0019de8d:
  if (local_398 != (JSON_Value *)0x0) {
    json_value_free(local_398);
  }
  return bVar12;
}

Assistant:

bool SayIntentionsConnection::ProcessFetchedData ()
{
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // Only proceed in case HTTP response was OK
    if (httpResponse != HTTP_OK) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // The entire JSON is an array of objects
    const JSON_Array* pArrAc = json_array(pRoot.get());
    if (!pArrAc) {
        LOG_MSG(logERR, "Expected a JSON Array, but got type %d",
                (int)json_type(pRoot.get()));
        IncErrCnt();
        return false;
    }
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );

    // Process all flights
    for (size_t i = 0; i < json_array_get_count(pArrAc); ++i)
    {
        const JSON_Object* pAc = json_array_get_object(pArrAc, i);
        if (!pAc) continue;
        
        // Displayname is matching? My own flight! -> Skip it
        if (jog_s(pAc, SI_DISPLAYNAME) == dataRefs.GetSIDisplayName())
            continue;

        // Key is the SayIntentions flight_id
        LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_SAYINTENTIONS,
                                     (unsigned long)jog_l(pAc, SI_KEY));
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;
        
        // Position
        positionTy pos (jog_n_nan(pAc, SI_LAT),
                        jog_n_nan(pAc, SI_LON),
                        jog_l(pAc, SI_ALT) * M_per_FT,
                        tsRequest,
                        jog_l(pAc, SI_HEADING));
        
        // SI returns all world's traffic, we restrict to what's within defined limits
        const double dist = pos.dist(viewPos);
        if (dist > dataRefs.GetFdStdDistance_m() )
            continue;
        
        // On ground?
        if (jog_l(pAc, SI_ALT_AGL) <= 0)
            pos.f.onGrnd = GND_ON;

        // from here on access to fdMap guarded by a mutex
        // until FD object is inserted and updated
        std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

        // get the fd object from the map, key is the flight_id,
        // this fetches an existing or, if not existing, creates a new one
        LTFlightData& fd = mapFd[fdKey];

        // also get the data access lock once and for all
        // so following fetch/update calls only make quick recursive calls
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        // now that we have the detail lock we can release the global one
        mapFdLock.unlock();

        // completely new? fill key fields
        if ( fd.empty() )
            fd.SetKey(fdKey);
        
        // -- fill static data --
        LTFlightData::FDStaticData stat;
        stat.reg            = jog_s(pAc, SI_REG);
        stat.acTypeIcao     = jog_s(pAc, SI_AC_TYPE);
        stat.call           = UnprocessCallSign(jog_s(pAc, SI_CALL));
        stat.setOrigDest(jog_s(pAc, SI_ORIGIN),
                         jog_s(pAc, SI_DEST));
        stat.flight         = jog_s(pAc, SI_DISPLAYNAME);
        
        // -- dynamic data --
        LTFlightData::FDDynamicData dyn;
        dyn.gnd             = pos.IsOnGnd();
        dyn.heading         = pos.heading();
        dyn.spd             = jog_n_nan(pAc, SI_SPD);
        dyn.ts              = pos.ts();
        dyn.pChannel        = this;
        
        // update the a/c's master data
        fd.UpdateData(std::move(stat), dist);
        
        // position is rather important, we check for validity
        if ( pos.isNormal(true) ) {
            fd.AddDynData(dyn, 0, 0, &pos);
        }
        else
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
    }
    
    // all good
    return true;
}